

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void do_crop_ext_reflect(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                        JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
                        jvirt_barray_ptr *dst_coef_arrays)

{
  JBLOCKROW paJVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  jpeg_component_info *pjVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  uint uVar12;
  uint uVar13;
  uint uVar14;
  JBLOCKARRAY ppaJVar15;
  jpeg_memory_mgr *pjVar16;
  JBLOCKARRAY ppaJVar17;
  uint uVar18;
  JBLOCKROW paJVar19;
  JBLOCKROW paJVar20;
  uint uVar21;
  jvirt_barray_ptr pjVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  undefined4 uVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  
  uVar2 = srcinfo->output_width;
  iVar3 = dstinfo->max_h_samp_factor;
  if (0 < dstinfo->num_components) {
    uVar4 = srcinfo->output_height;
    iVar5 = dstinfo->max_v_samp_factor;
    lVar23 = 0;
    do {
      pjVar7 = dstinfo->comp_info;
      if (pjVar7[lVar23].height_in_blocks != 0) {
        iVar6 = pjVar7[lVar23].v_samp_factor;
        uVar21 = pjVar7[lVar23].h_samp_factor * (uVar2 / (uint)(iVar3 << 3));
        uVar25 = pjVar7[lVar23].h_samp_factor * x_crop_offset;
        uVar18 = iVar6 * y_crop_offset;
        uVar26 = 0;
        do {
          ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,dst_coef_arrays[lVar23],uVar26,
                                 pjVar7[lVar23].v_samp_factor,1);
          if (srcinfo->output_height < dstinfo->image_height) {
            if ((uVar18 <= uVar26) &&
               (uVar26 < iVar6 * (uVar4 / (uint)(iVar5 << 3) + y_crop_offset))) {
              pjVar16 = srcinfo->mem;
              pjVar22 = src_coef_arrays[lVar23];
              uVar14 = -uVar18;
              goto LAB_00107222;
            }
            if (0 < pjVar7[lVar23].v_samp_factor) {
              lVar27 = 0;
              do {
                memset(ppaJVar15[lVar27],0,(ulong)pjVar7[lVar23].width_in_blocks << 7);
                lVar27 = lVar27 + 1;
              } while (lVar27 < pjVar7[lVar23].v_samp_factor);
            }
          }
          else {
            pjVar16 = srcinfo->mem;
            pjVar22 = src_coef_arrays[lVar23];
            uVar14 = uVar18;
LAB_00107222:
            ppaJVar17 = (*pjVar16->access_virt_barray)
                                  ((j_common_ptr)srcinfo,pjVar22,uVar26 + uVar14,
                                   pjVar7[lVar23].v_samp_factor,0);
            if (0 < pjVar7[lVar23].v_samp_factor) {
              lVar27 = 0;
              do {
                jcopy_block_row(ppaJVar17[lVar27],ppaJVar15[lVar27] + uVar25,uVar21);
                auVar34._8_8_ = extraout_XMM1_Qb;
                auVar34._0_8_ = extraout_XMM1_Qa;
                if (uVar25 != 0) {
                  paJVar19 = ppaJVar15[lVar27] + uVar25;
                  uVar14 = uVar21;
                  paJVar20 = paJVar19;
                  uVar13 = uVar25;
                  uVar12 = uVar21;
joined_r0x00107276:
                  do {
                    if (uVar12 != 0) {
                      paJVar1 = paJVar19 + -1;
                      lVar24 = -0x20;
                      do {
                        auVar28 = *(undefined1 (*) [16])(paJVar20[1] + lVar24 * 2);
                        auVar34 = pshuflw(auVar34,auVar28,0xe7);
                        auVar34 = pshufhw(auVar34,auVar34,0xe7);
                        auVar35._0_4_ = auVar34._0_4_;
                        auVar35._8_4_ = auVar34._8_4_;
                        auVar35._12_4_ = auVar34._12_4_;
                        auVar35._4_4_ = auVar35._8_4_;
                        auVar34 = pshuflw(auVar35,auVar35,0xb1);
                        auVar28 = pshuflw(auVar28,auVar28,0xe8);
                        auVar28 = pshufhw(auVar28,auVar28,0xe8);
                        uVar33 = auVar28._8_4_;
                        auVar30._0_10_ = (unkuint10)CONCAT44(uVar33,uVar33) << 0x20;
                        auVar10._8_2_ = auVar28._10_2_;
                        auVar10._0_8_ = CONCAT44(uVar33,uVar33);
                        auVar10._10_2_ = -auVar34._6_2_;
                        auVar30._12_4_ = auVar10._8_4_;
                        auVar30._10_2_ = -auVar34._4_2_;
                        auVar8._4_2_ = auVar28._8_2_;
                        auVar8._0_4_ = uVar33;
                        auVar8._6_6_ = auVar30._10_6_;
                        auVar29._8_8_ = auVar8._4_8_;
                        auVar29._6_2_ = -auVar34._2_2_;
                        auVar29._4_2_ = auVar28._2_2_;
                        auVar29._0_2_ = auVar28._0_2_;
                        auVar29._2_2_ = -auVar34._0_2_;
                        *(undefined1 (*) [16])(*paJVar19 + lVar24 * 2) = auVar29;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 0);
                      uVar13 = uVar13 - 1;
                      paJVar19 = paJVar1;
                      if (uVar14 - 1 != 0) {
                        uVar14 = uVar14 - 1;
                        paJVar20 = paJVar20 + 1;
                        uVar12 = uVar13;
                        goto joined_r0x00107276;
                      }
                    }
                    uVar14 = uVar21;
                    paJVar20 = paJVar19;
                    uVar12 = uVar21;
                  } while (uVar13 != 0);
                }
                uVar14 = pjVar7[lVar23].width_in_blocks - (uVar25 + uVar21);
                if ((uVar25 + uVar21 <= pjVar7[lVar23].width_in_blocks && uVar14 != 0) &&
                   (uVar14 != 0)) {
                  paJVar20 = ppaJVar15[lVar27] + (ulong)uVar25 + (ulong)uVar21;
                  uVar13 = uVar21;
                  paJVar19 = paJVar20;
                  uVar12 = uVar21;
joined_r0x00107302:
                  do {
                    if (uVar12 != 0) {
                      lVar24 = -0x20;
                      do {
                        auVar28 = *(undefined1 (*) [16])(*paJVar19 + lVar24 * 2);
                        auVar34 = pshuflw(auVar34,auVar28,0xe7);
                        auVar34 = pshufhw(auVar34,auVar34,0xe7);
                        auVar36._0_4_ = auVar34._0_4_;
                        auVar36._8_4_ = auVar34._8_4_;
                        auVar36._12_4_ = auVar34._12_4_;
                        auVar36._4_4_ = auVar36._8_4_;
                        auVar34 = pshuflw(auVar36,auVar36,0xb1);
                        auVar28 = pshuflw(auVar28,auVar28,0xe8);
                        auVar28 = pshufhw(auVar28,auVar28,0xe8);
                        uVar33 = auVar28._8_4_;
                        auVar32._0_10_ = (unkuint10)CONCAT44(uVar33,uVar33) << 0x20;
                        auVar11._8_2_ = auVar28._10_2_;
                        auVar11._0_8_ = CONCAT44(uVar33,uVar33);
                        auVar11._10_2_ = -auVar34._6_2_;
                        auVar32._12_4_ = auVar11._8_4_;
                        auVar32._10_2_ = -auVar34._4_2_;
                        auVar9._4_2_ = auVar28._8_2_;
                        auVar9._0_4_ = uVar33;
                        auVar9._6_6_ = auVar32._10_6_;
                        auVar31._8_8_ = auVar9._4_8_;
                        auVar31._6_2_ = -auVar34._2_2_;
                        auVar31._4_2_ = auVar28._2_2_;
                        auVar31._0_2_ = auVar28._0_2_;
                        auVar31._2_2_ = -auVar34._0_2_;
                        *(undefined1 (*) [16])(paJVar20[1] + lVar24 * 2) = auVar31;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 0);
                      paJVar20 = paJVar20 + 1;
                      uVar14 = uVar14 - 1;
                      uVar13 = uVar13 - 1;
                      paJVar19 = paJVar19 + -1;
                      uVar12 = uVar14;
                      if (uVar13 != 0) goto joined_r0x00107302;
                    }
                    uVar13 = uVar21;
                    paJVar19 = paJVar20;
                    uVar12 = uVar21;
                  } while (uVar14 != 0);
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 < pjVar7[lVar23].v_samp_factor);
            }
          }
          uVar26 = uVar26 + pjVar7[lVar23].v_samp_factor;
        } while (uVar26 < pjVar7[lVar23].height_in_blocks);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < dstinfo->num_components);
  }
  return;
}

Assistant:

LOCAL(void)
do_crop_ext_reflect(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                    JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
                    jvirt_barray_ptr *src_coef_arrays,
                    jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop.
 * Extension: The destination width is larger than the source, and we fill in
 * the expanded region with repeated reflections of the source image.  Note
 * that we also have to fill partial iMCUs at the right and bottom edge of the
 * source image area in this case.
 */
{
  JDIMENSION MCU_cols, MCU_rows, comp_width, comp_height, src_blk_x;
  JDIMENSION dst_blk_x, dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, k, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  JBLOCKROW src_row_ptr, dst_row_ptr;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);
  MCU_rows = srcinfo->output_height /
             (dstinfo->max_v_samp_factor * dstinfo_min_DCT_v_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    comp_height = MCU_rows * compptr->v_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      if (dstinfo->_jpeg_height > srcinfo->output_height) {
        if (dst_blk_y < y_crop_blocks ||
            dst_blk_y >= y_crop_blocks + comp_height) {
          for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
            MEMZERO(dst_buffer[offset_y],
                    compptr->width_in_blocks * sizeof(JBLOCK));
          }
          continue;
        }
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y - y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      } else {
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y + y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      }
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        /* Copy source region */
        jcopy_block_row(src_buffer[offset_y],
                        dst_buffer[offset_y] + x_crop_blocks, comp_width);
        if (x_crop_blocks > 0) {
          /* Reflect to left */
          dst_row_ptr = dst_buffer[offset_y] + x_crop_blocks;
          for (dst_blk_x = x_crop_blocks; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;      /* (re)set axis of reflection */
            for (src_blk_x = comp_width; src_blk_x > 0 && dst_blk_x > 0;
                 src_blk_x--, dst_blk_x--) {
              dst_ptr = *(--dst_row_ptr);   /* destination goes left */
              src_ptr = *src_row_ptr++;     /* source goes right */
              /* This unrolled loop doesn't need to know which row it's on. */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;    /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign
                                               change */
              }
            }
          }
        }
        if (compptr->width_in_blocks > x_crop_blocks + comp_width) {
          /* Reflect to right */
          dst_row_ptr = dst_buffer[offset_y] + x_crop_blocks + comp_width;
          for (dst_blk_x = compptr->width_in_blocks - x_crop_blocks - comp_width;
               dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;      /* (re)set axis of reflection */
            for (src_blk_x = comp_width; src_blk_x > 0 && dst_blk_x > 0;
                 src_blk_x--, dst_blk_x--) {
              dst_ptr = *dst_row_ptr++;     /* destination goes right */
              src_ptr = *(--src_row_ptr);   /* source goes left */
              /* This unrolled loop doesn't need to know which row it's on. */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;    /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign
                                               change */
              }
            }
          }
        }
      }
    }
  }
}